

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O1

event_process_result __thiscall
afsm::
state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
process_event_impl<afsm::test::events::end_array>
          (state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,end_array *event,process_type<actions::event_process_result::process> *sel)

{
  _Rb_tree_header *p_Var1;
  event_process_result eVar2;
  _Elt_pointer prVar3;
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  _Stack_48;
  
  prVar3 = ((iterator *)
           ((long)&(this->
                   super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                   ).super_type.
                   super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
                   .
                   super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
                   .regions_.state_stack_.
                   super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
           + 0x30))->_M_cur;
  if (prVar3 == *(_Elt_pointer *)
                 ((long)&(this->
                         super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                         ).super_type.
                         super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
                         .
                         super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
                         .regions_.state_stack_.
                         super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
                 + 0x38)) {
    prVar3 = (*(_Map_pointer *)
               ((long)&(this->
                       super_state_machine_base<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                       ).super_type.
                       super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
                       .
                       super_region_container<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long,_true>
                       .regions_.state_stack_.
                       super__Deque_base<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>,_std::allocator<afsm::orthogonal::regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>_>_>
               + 0x48))[-1] + 3;
  }
  eVar2 = transitions::
          state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
          ::process_event<afsm::test::events::end_array>
                    ((state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
                      *)&prVar3[-1].regions_.
                         super__Tuple_impl<0UL,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                         .
                         super__Head_base<0UL,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_false>
                         ._M_head_impl.
                         super_state_machine_base<afsm::test::json_parser_def::context,_afsm::none,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                         .super_type.
                         super_transition_container<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
                     ,event);
  if (eVar2 == defer) {
    defer_event<afsm::test::events::end_array>(this,event);
  }
  else if (eVar2 == process) {
    detail::
    orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
    ::current_handled_events
              ((event_set *)&_Stack_48,
               (orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                *)this);
    std::
    _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::clear(&(this->handled_)._M_t);
    if (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &_Stack_48._M_impl.super__Rb_tree_header;
      (this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_color;
      (this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left;
      (this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(this->handled_)._M_t._M_impl.super__Rb_tree_header._M_header;
      (this->handled_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           _Stack_48._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_48._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::~_Rb_tree(&_Stack_48);
    detail::
    orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
    ::current_deferrable_events
              ((event_set *)&_Stack_48,
               (orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                *)this);
    std::
    _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::clear(&(this->deferred_)._M_t);
    if (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &_Stack_48._M_impl.super__Rb_tree_header;
      (this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_color;
      (this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left;
      (this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_header;
      (this->deferred_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           _Stack_48._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_48._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
    ::~_Rb_tree(&_Stack_48);
    process_deferred_queue(this);
  }
  return eVar2;
}

Assistant:

actions::event_process_result
    process_event_impl(Event&& event,
        detail::process_type<actions::event_process_result::process> const& sel)
    {
        using actions::event_process_result;
        observer_wrapper::start_process_event(*this, ::std::forward<Event>(event));
        auto res = base_machine_type::process_event_impl(*this, ::std::forward<Event>(event), sel );
        switch (res) {
            case event_process_result::process:
                // Changed state. Process deferred events
                handled_    = base_machine_type::current_handled_events();
                deferred_   = base_machine_type::current_deferrable_events();
                process_deferred_queue();
                break;
            case event_process_result::process_in_state:
                observer_wrapper::processed_in_state(*this, ::std::forward<Event>(event));
                break;
            case event_process_result::defer:
                // Add event to deferred queue
                defer_event(::std::forward<Event>(event));
                break;
            case event_process_result::refuse:
                // The event cannot be processed in current state
                observer_wrapper::reject_event(*this, ::std::forward<Event>(event));
                return reject_event_impl(::std::forward<Event>(event),
                        ::std::integral_constant<bool,
                        actions::detail::handles_reject<T, Event>::value>{});
            default:
                break;
        }
        return res;
    }